

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd_test.c
# Opt level: O3

void test_sfd_listen(void)

{
  char cVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  nng_listener local_38;
  nng_socket local_34;
  nng_listener l;
  nng_socket s1;
  nng_url *u;
  
  nVar2 = nng_pair1_open(&local_34);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                         ,0x3a,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar4,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_listen(local_34,"socket://",&local_38,0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                           ,0x3b,"%s: expected success, got %s (%d)",
                           "nng_listen(s1, \"socket://\", &l, 0)",pcVar4,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_listener_get_url(local_38,(nng_url **)&l);
      pcVar4 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                             ,0x3c,"%s: expected success, got %s (%d)","nng_listener_get_url(l, &u)"
                             ,pcVar4,nVar2);
      if (iVar3 != 0) {
        pcVar4 = nng_url_scheme(_l);
        iVar3 = strcmp(pcVar4,"socket");
        pcVar4 = nng_url_scheme(_l);
        acutest_check_((uint)(iVar3 == 0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x3d,"%s == %s",pcVar4,"socket",nVar2);
        pcVar4 = nng_url_path(_l);
        cVar1 = *pcVar4;
        pcVar4 = nng_url_path(_l);
        acutest_check_((uint)(cVar1 == '\0'),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x3e,"%s == %s",pcVar4,"");
        pcVar4 = nng_url_userinfo(_l);
        pcVar5 = nng_url_userinfo(_l);
        acutest_check_((uint)(pcVar4 == (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x3f,"%p == NULL",pcVar5);
        pcVar4 = nng_url_hostname(_l);
        pcVar5 = nng_url_hostname(_l);
        acutest_check_((uint)(pcVar4 == (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x40,"%p == NULL",pcVar5);
        pcVar4 = nng_url_query(_l);
        pcVar5 = nng_url_query(_l);
        acutest_check_((uint)(pcVar4 == (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x41,"%p == NULL",pcVar5);
        pcVar4 = nng_url_fragment(_l);
        pcVar5 = nng_url_fragment(_l);
        acutest_check_((uint)(pcVar4 == (char *)0x0),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                       ,0x42,"%p == NULL",pcVar5);
        nVar2 = nng_socket_close(local_34);
        pcVar4 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/socket/sockfd_test.c"
                               ,0x44,"%s: expected success, got %s (%d)","nng_socket_close(s1)",
                               pcVar4,nVar2);
        if (iVar3 != 0) {
          return;
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_sfd_listen(void)
{
	nng_socket     s1;
	nng_listener   l;
	const nng_url *u;

	NUTS_OPEN(s1);
	NUTS_PASS(nng_listen(s1, "socket://", &l, 0));
	NUTS_PASS(nng_listener_get_url(l, &u));
	NUTS_MATCH(nng_url_scheme(u), "socket");
	NUTS_MATCH(nng_url_path(u), "");
	NUTS_NULL(nng_url_userinfo(u));
	NUTS_NULL(nng_url_hostname(u));
	NUTS_NULL(nng_url_query(u));
	NUTS_NULL(nng_url_fragment(u));

	NUTS_CLOSE(s1);
}